

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void gen_goto_tb(DisasContext_conflict14 *ctx,int n,target_ulong_conflict dest)

{
  TCGContext_conflict9 *tcg_ctx;
  TCGContext_conflict9 *tcg_ctx_00;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  if (((ctx->base).singlestep_enabled == false) && ((((ctx->base).tb)->pc ^ dest) < 0x4000)) {
    tcg_gen_goto_tb_tricore(tcg_ctx,n);
    tcg_ctx_00 = ctx->uc->tcg_ctx;
    tcg_gen_op2_tricore(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(tcg_ctx_00->cpu_PC + (long)tcg_ctx_00)
                        ,(long)(int)dest);
    tcg_gen_exit_tb_tricore(tcg_ctx,(TranslationBlock *)(ctx->base).tb,n);
    return;
  }
  gen_goto_tb_cold_1();
  return;
}

Assistant:

static inline void gen_goto_tb(DisasContext *s, int n, uint64_t dest)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TranslationBlock *tb;

    tb = s->base.tb;
    if (use_goto_tb(s, n, dest)) {
        tcg_gen_goto_tb(tcg_ctx, n);
        gen_a64_set_pc_im(tcg_ctx, dest);
        tcg_gen_exit_tb(tcg_ctx, tb, n);
        s->base.is_jmp = DISAS_NORETURN;
    } else {
        gen_a64_set_pc_im(tcg_ctx, dest);
        if (s->ss_active) {
            gen_step_complete_exception(s);
        } else if (s->base.singlestep_enabled) {
            gen_exception_internal(tcg_ctx, EXCP_DEBUG);
        } else {
            tcg_gen_lookup_and_goto_ptr(tcg_ctx);
            s->base.is_jmp = DISAS_NORETURN;
        }
    }
}